

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

pair<wasm::Expression_*,_wasm::Expression_*> __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
          (UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this
          )

{
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this_local;
  pair<wasm::Expression_*,_wasm::Expression_*> ret;
  
  _this_local = UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
                          (&this->
                            super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                          );
  std::
  unordered_set<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ::insert(&this->processed,(value_type *)&this_local);
  return _this_local;
}

Assistant:

T pop() {
    T ret = UniqueDeferredQueue<T>::pop();
    processed.insert(ret);
    return ret;
  }